

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Witness_complex.h
# Opt level: O1

bool __thiscall
Gudhi::witness_complex::
Witness_complex<std::vector<std::vector<std::pair<unsigned_long,double>,std::allocator<std::pair<unsigned_long,double>>>,std::allocator<std::vector<std::pair<unsigned_long,double>,std::allocator<std::pair<unsigned_long,double>>>>>>
::create_complex<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>>
          (Witness_complex<std::vector<std::vector<std::pair<unsigned_long,double>,std::allocator<std::pair<unsigned_long,double>>>,std::allocator<std::vector<std::pair<unsigned_long,double>,std::allocator<std::pair<unsigned_long,double>>>>>>
           *this,Simplex_tree<Gudhi::Simplex_tree_options_default> *complex,double max_alpha_square,
          size_t limit_dimension)

{
  Active_witness<std::pair<unsigned_long,_double>,_std::vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>_>
  *aw;
  vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>
  *pvVar1;
  iterator iVar2;
  iterator curr_l;
  iterator end;
  iterator __position;
  bool bVar3;
  _Node *p_Var4;
  long lVar5;
  vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_> *w;
  vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>
  *__args;
  ulong uVar6;
  char *pcVar7;
  Nearest_landmark_table_internal *__range3;
  vector<unsigned_long,_std::allocator<unsigned_long>_> simplex;
  ActiveWitnessList active_witnesses;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_b8;
  _List_base<Gudhi::witness_complex::Active_witness<std::pair<unsigned_long,_double>,_std::vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>_>,_std::allocator<Gudhi::witness_complex::Active_witness<std::pair<unsigned_long,_double>,_std::vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>_>_>_>
  local_98;
  size_t local_80;
  size_type local_78;
  double local_70;
  Pair_iterator local_68;
  Active_witness<std::pair<unsigned_long,_double>,_std::vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>_>
  *local_60;
  Active_witness<std::pair<unsigned_long,_double>,_std::vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>_>
  *pAStack_58;
  undefined1 local_50;
  undefined7 uStack_4f;
  Active_witness_iterator<Gudhi::witness_complex::Active_witness<std::pair<unsigned_long,_double>,_std::vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>_>,_std::pair<unsigned_long,_double>,___gnu_cxx::__normal_iterator<std::pair<unsigned_long,_double>_*,_std::vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>_>_>
  local_48;
  
  if ((complex->root_).members_.m_flat_tree.m_data.m_seq.m_holder.m_size == 0) {
    local_70 = max_alpha_square;
    if (0.0 <= max_alpha_square) {
      local_98._M_impl._M_node._M_size = 0;
      __args = *(vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>
                 **)this;
      pvVar1 = *(vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>
                 **)(this + 8);
      local_98._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&local_98;
      local_98._M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)&local_98;
      local_80 = limit_dimension;
      if (__args != pvVar1) {
        do {
          p_Var4 = std::__cxx11::
                   list<Gudhi::witness_complex::Active_witness<std::pair<unsigned_long,double>,std::vector<std::pair<unsigned_long,double>,std::allocator<std::pair<unsigned_long,double>>>>,std::allocator<Gudhi::witness_complex::Active_witness<std::pair<unsigned_long,double>,std::vector<std::pair<unsigned_long,double>,std::allocator<std::pair<unsigned_long,double>>>>>>
                   ::
                   _M_create_node<std::vector<std::pair<unsigned_long,double>,std::allocator<std::pair<unsigned_long,double>>>const&>
                             ((list<Gudhi::witness_complex::Active_witness<std::pair<unsigned_long,double>,std::vector<std::pair<unsigned_long,double>,std::allocator<std::pair<unsigned_long,double>>>>,std::allocator<Gudhi::witness_complex::Active_witness<std::pair<unsigned_long,double>,std::vector<std::pair<unsigned_long,double>,std::allocator<std::pair<unsigned_long,double>>>>>>
                               *)&local_98,__args);
          std::__detail::_List_node_base::_M_hook(&p_Var4->super__List_node_base);
          local_98._M_impl._M_node._M_size = local_98._M_impl._M_node._M_size + 1;
          __args = __args + 1;
        } while (__args != pvVar1);
      }
      if (local_98._M_impl._M_node.super__List_node_base._M_next != (_List_node_base *)&local_98) {
        uVar6 = 0;
        do {
          iVar2._M_node = local_98._M_impl._M_node.super__List_node_base._M_next;
          local_b8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)0x0;
          local_b8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)0x0;
          local_b8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          local_78 = uVar6 + 1;
          std::vector<unsigned_long,_std::allocator<unsigned_long>_>::reserve(&local_b8,local_78);
          while (__position._M_node = iVar2._M_node,
                __position._M_node != (_List_node_base *)&local_98) {
            aw = (Active_witness<std::pair<unsigned_long,_double>,_std::vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>_>
                  *)(__position._M_node + 1);
            local_68._M_node = __position._M_node[1]._M_next;
            Active_witness_iterator<Gudhi::witness_complex::Active_witness<std::pair<unsigned_long,_double>,_std::vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>_>,_std::pair<unsigned_long,_double>,___gnu_cxx::__normal_iterator<std::pair<unsigned_long,_double>_*,_std::vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>_>_>
            ::Active_witness_iterator(&local_48,aw,&local_68);
            local_50 = 1;
            end._17_7_ = uStack_4f;
            end.is_end_ = true;
            curr_l.lh_._M_node = local_48.lh_._M_node;
            curr_l.aw_ = local_48.aw_;
            curr_l.is_end_ = local_48.is_end_;
            curr_l._17_7_ = local_48._17_7_;
            end.lh_._M_node = (_List_node_base *)aw;
            end.aw_ = aw;
            local_60 = aw;
            pAStack_58 = aw;
            bVar3 = add_all_faces_of_dimension<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>>
                              (this,(int)uVar6,local_70,INFINITY,curr_l,&local_b8,complex,end);
            if (local_b8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_start !=
                local_b8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_finish) {
              __assert_fail("simplex.empty()",
                            "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Witness_complex/include/gudhi/Witness_complex.h"
                            ,0x74,
                            "bool Gudhi::witness_complex::Witness_complex<std::vector<std::vector<std::pair<unsigned long, double>>>>::create_complex(SimplicialComplexForWitness &, double, std::size_t) const [Nearest_landmark_table_ = std::vector<std::vector<std::pair<unsigned long, double>>>, SimplicialComplexForWitness = Gudhi::Simplex_tree<>]"
                           );
            }
            iVar2._M_node = (__position._M_node)->_M_next;
            if (!bVar3) {
              std::__cxx11::
              list<Gudhi::witness_complex::Active_witness<std::pair<unsigned_long,_double>,_std::vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>_>,_std::allocator<Gudhi::witness_complex::Active_witness<std::pair<unsigned_long,_double>,_std::vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>_>_>_>
              ::_M_erase((list<Gudhi::witness_complex::Active_witness<std::pair<unsigned_long,_double>,_std::vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>_>,_std::allocator<Gudhi::witness_complex::Active_witness<std::pair<unsigned_long,_double>,_std::vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>_>_>_>
                          *)&local_98,__position);
            }
          }
          if (local_b8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_b8.
                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                            _M_impl.super__Vector_impl_data._M_start,
                            (long)local_b8.
                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage -
                            (long)local_b8.
                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                  _M_impl.super__Vector_impl_data._M_start);
          }
        } while ((local_78 <= local_80) &&
                (uVar6 = local_78,
                local_98._M_impl._M_node.super__List_node_base._M_next !=
                (_List_node_base *)&local_98));
      }
      std::__cxx11::
      _List_base<Gudhi::witness_complex::Active_witness<std::pair<unsigned_long,_double>,_std::vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>_>,_std::allocator<Gudhi::witness_complex::Active_witness<std::pair<unsigned_long,_double>,_std::vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>_>_>_>
      ::_M_clear(&local_98);
      return true;
    }
    pcVar7 = 
    "Witness complex cannot create complex - squared relaxation parameter must be non-negative.\n";
    lVar5 = 0x5b;
  }
  else {
    pcVar7 = "Witness complex cannot create complex - complex is not empty.\n";
    lVar5 = 0x3e;
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar7,lVar5);
  return false;
}

Assistant:

bool create_complex(SimplicialComplexForWitness& complex,
                      double  max_alpha_square,
                      std::size_t limit_dimension = std::numeric_limits<std::size_t>::max()) const {
    if (complex.num_vertices() > 0) {
      std::cerr << "Witness complex cannot create complex - complex is not empty.\n";
      return false;
    }
    if (max_alpha_square < 0) {
      std::cerr << "Witness complex cannot create complex - squared relaxation parameter must be non-negative.\n";
      return false;
    }
    ActiveWitnessList active_witnesses;
    Landmark_id k = 0; /* current dimension in iterative construction */
    for (auto&& w : nearest_landmark_table_)
      active_witnesses.emplace_back(w);
    while (!active_witnesses.empty() && k <= limit_dimension) {
      typename ActiveWitnessList::iterator aw_it = active_witnesses.begin();
      std::vector<Landmark_id> simplex;
      simplex.reserve(k+1);
      while (aw_it != active_witnesses.end()) {
        bool ok = add_all_faces_of_dimension(k,
                                             max_alpha_square,
                                             std::numeric_limits<double>::infinity(),
                                             aw_it->begin(),
                                             simplex,
                                             complex,
                                             aw_it->end());
        assert(simplex.empty());
        if (!ok)
          active_witnesses.erase(aw_it++);  // First increase the iterator and then erase the previous element
        else
          aw_it++;
      }
      k++;
    }
    return true;
  }